

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscHelper.cpp
# Opt level: O3

void adios2::core::engine::ssc::SerializeAttributes(IO *input,Buffer *output)

{
  long *plVar1;
  uint8_t *puVar2;
  Attribute AVar3;
  uint8_t *puVar4;
  long lVar5;
  void *pvVar6;
  undefined8 uVar7;
  long lVar8;
  Attribute *pAVar9;
  long *plVar10;
  size_t sVar11;
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  IO *local_220;
  Buffer *local_218;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_220 = input;
  lVar8 = adios2::core::IO::GetAttributes_abi_cxx11_();
  plVar10 = *(long **)(lVar8 + 0x10);
  if (plVar10 != (long *)0x0) {
    lVar8 = *(long *)output->m_Buffer;
    local_218 = output;
    do {
      Buffer::resize(output,lVar8 + 0x400);
      if (0xe < *(int *)(plVar10[5] + 0x28) - 1U) goto LAB_0013406a;
      plVar1 = plVar10 + 1;
      switch(*(int *)(plVar10[5] + 0x28)) {
      case 1:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<signed_char>
                           (local_220,plVar1,local_240,(string *)local_70);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
        }
        output->m_Buffer[lVar8] = 'B';
        *(Attribute *)(output->m_Buffer + lVar8 + 1) = pAVar9[0x28];
        *(Attribute *)(output->m_Buffer + lVar8 + 2) = pAVar9[0x10];
        memcpy(output->m_Buffer + lVar8 + 3,*(void **)(pAVar9 + 8),*(size_t *)(pAVar9 + 0x10));
        lVar8 = lVar8 + 3 + *(long *)(pAVar9 + 0x10);
        AVar3 = pAVar9[0x38];
        goto joined_r0x0013360b;
      case 2:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<short>
                           (local_220,plVar1,local_240,(string *)local_90);
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
        if (local_240[0] != local_230) {
LAB_00133b1c:
          operator_delete(local_240[0]);
        }
        goto LAB_00133b21;
      case 3:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<int>
                           (local_220,plVar1,local_240,(string *)local_b0);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0]);
        }
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
        }
        goto LAB_00133de0;
      case 4:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_1f0[0] = local_1e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<long>
                           (local_220,plVar1,local_240,(string *)local_1f0);
        if (local_1f0[0] != local_1e0) {
          operator_delete(local_1f0[0]);
        }
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
        }
        output->m_Buffer[lVar8] = 'B';
        *(Attribute *)(output->m_Buffer + lVar8 + 1) = pAVar9[0x28];
        *(Attribute *)(output->m_Buffer + lVar8 + 2) = pAVar9[0x10];
        memcpy(output->m_Buffer + lVar8 + 3,*(void **)(pAVar9 + 8),*(size_t *)(pAVar9 + 0x10));
        lVar8 = lVar8 + 3 + *(long *)(pAVar9 + 0x10);
        if (pAVar9[0x38] != (Attribute)0x1) goto LAB_0013403b;
LAB_00133a6f:
        puVar4 = output->m_Buffer;
        puVar2 = puVar4 + lVar8;
        puVar2[0] = '\b';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
        *(undefined8 *)(puVar4 + lVar8 + 8) = *(undefined8 *)(pAVar9 + 0x58);
        lVar8 = lVar8 + 0x10;
        break;
      case 5:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<unsigned_char>
                           (local_220,plVar1,local_240,(string *)local_d0);
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0]);
        }
        output = local_218;
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
          output = local_218;
        }
        goto LAB_001335c7;
      case 6:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<unsigned_short>
                           (local_220,plVar1,local_240,(string *)local_f0);
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0]);
        }
        if (local_240[0] != local_230) goto LAB_00133b1c;
LAB_00133b21:
        output = local_218;
        local_218->m_Buffer[lVar8] = 'B';
        *(Attribute *)(local_218->m_Buffer + lVar8 + 1) = pAVar9[0x28];
        *(Attribute *)(local_218->m_Buffer + lVar8 + 2) = pAVar9[0x10];
        memcpy(local_218->m_Buffer + lVar8 + 3,*(void **)(pAVar9 + 8),*(size_t *)(pAVar9 + 0x10));
        lVar8 = lVar8 + 3 + *(long *)(pAVar9 + 0x10);
        if (pAVar9[0x38] == (Attribute)0x1) {
          puVar4 = output->m_Buffer;
          puVar2 = puVar4 + lVar8;
          puVar2[0] = '\x02';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          puVar2[4] = '\0';
          puVar2[5] = '\0';
          puVar2[6] = '\0';
          puVar2[7] = '\0';
          *(undefined2 *)(puVar4 + lVar8 + 8) = *(undefined2 *)(pAVar9 + 0x58);
          lVar8 = lVar8 + 10;
        }
        else {
LAB_00133b8c:
          pvVar6 = *(void **)(pAVar9 + 0x40);
          sVar11 = *(long *)(pAVar9 + 0x48) - (long)pvVar6;
          puVar2 = output->m_Buffer;
          *(size_t *)(puVar2 + lVar8) = sVar11;
          memcpy((size_t *)((long)(puVar2 + lVar8) + 8),pvVar6,sVar11);
          lVar8 = lVar8 + sVar11 + 8;
        }
        break;
      case 7:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_110[0] = local_100;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<unsigned_int>
                           (local_220,plVar1,local_240,(string *)local_110);
        if (local_110[0] != local_100) {
          operator_delete(local_110[0]);
        }
        output = local_218;
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
          output = local_218;
        }
LAB_00133de0:
        output->m_Buffer[lVar8] = 'B';
        *(Attribute *)(output->m_Buffer + lVar8 + 1) = pAVar9[0x28];
        *(Attribute *)(output->m_Buffer + lVar8 + 2) = pAVar9[0x10];
        memcpy(output->m_Buffer + lVar8 + 3,*(void **)(pAVar9 + 8),*(size_t *)(pAVar9 + 0x10));
        lVar8 = lVar8 + 3 + *(long *)(pAVar9 + 0x10);
        if (pAVar9[0x38] != (Attribute)0x1) goto LAB_0013403b;
        puVar4 = output->m_Buffer;
        puVar2 = puVar4 + lVar8;
        puVar2[0] = '\x04';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
        *(undefined4 *)(puVar4 + lVar8 + 8) = *(undefined4 *)(pAVar9 + 0x58);
LAB_00134035:
        lVar8 = lVar8 + 0xc;
        break;
      case 8:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_130[0] = local_120;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<unsigned_long>
                           (local_220,plVar1,local_240,(string *)local_130);
        if (local_130[0] != local_120) {
          operator_delete(local_130[0]);
        }
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
        }
        output = local_218;
        local_218->m_Buffer[lVar8] = 'B';
        *(Attribute *)(local_218->m_Buffer + lVar8 + 1) = pAVar9[0x28];
        *(Attribute *)(local_218->m_Buffer + lVar8 + 2) = pAVar9[0x10];
        memcpy(local_218->m_Buffer + lVar8 + 3,*(void **)(pAVar9 + 8),*(size_t *)(pAVar9 + 0x10));
        lVar8 = lVar8 + 3 + *(long *)(pAVar9 + 0x10);
        if (pAVar9[0x38] == (Attribute)0x1) goto LAB_00133a6f;
        goto LAB_0013403b;
      case 9:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_150[0] = local_140;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<float>
                           (local_220,plVar1,local_240,(string *)local_150);
        if (local_150[0] != local_140) {
          operator_delete(local_150[0]);
        }
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
        }
        output = local_218;
        local_218->m_Buffer[lVar8] = 'B';
        *(Attribute *)(local_218->m_Buffer + lVar8 + 1) = pAVar9[0x28];
        *(Attribute *)(local_218->m_Buffer + lVar8 + 2) = pAVar9[0x10];
        memcpy(local_218->m_Buffer + lVar8 + 3,*(void **)(pAVar9 + 8),*(size_t *)(pAVar9 + 0x10));
        lVar8 = lVar8 + 3 + *(long *)(pAVar9 + 0x10);
        if (pAVar9[0x38] != (Attribute)0x1) goto LAB_0013403b;
        puVar4 = output->m_Buffer;
        puVar2 = puVar4 + lVar8;
        puVar2[0] = '\x04';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
        *(undefined4 *)(puVar4 + lVar8 + 8) = *(undefined4 *)(pAVar9 + 0x58);
        goto LAB_00134035;
      case 10:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_170[0] = local_160;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<double>
                           (local_220,plVar1,local_240,(string *)local_170);
        if (local_170[0] != local_160) {
          operator_delete(local_170[0]);
        }
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
        }
        output = local_218;
        local_218->m_Buffer[lVar8] = 'B';
        *(Attribute *)(local_218->m_Buffer + lVar8 + 1) = pAVar9[0x28];
        *(Attribute *)(local_218->m_Buffer + lVar8 + 2) = pAVar9[0x10];
        memcpy(local_218->m_Buffer + lVar8 + 3,*(void **)(pAVar9 + 8),*(size_t *)(pAVar9 + 0x10));
        lVar8 = lVar8 + 3 + *(long *)(pAVar9 + 0x10);
        if (pAVar9[0x38] != (Attribute)0x1) goto LAB_00133b8c;
        puVar4 = output->m_Buffer;
        puVar2 = puVar4 + lVar8;
        puVar2[0] = '\b';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
        *(undefined8 *)(puVar4 + lVar8 + 8) = *(undefined8 *)(pAVar9 + 0x58);
LAB_0013381e:
        lVar8 = lVar8 + 0x10;
        break;
      case 0xb:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_190[0] = local_180;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<long_double>
                           (local_220,plVar1,local_240,(string *)local_190);
        if (local_190[0] != local_180) {
          operator_delete(local_190[0]);
        }
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
        }
        output = local_218;
        local_218->m_Buffer[lVar8] = 'B';
        *(Attribute *)(local_218->m_Buffer + lVar8 + 1) = pAVar9[0x28];
        *(Attribute *)(local_218->m_Buffer + lVar8 + 2) = pAVar9[0x10];
        memcpy(local_218->m_Buffer + lVar8 + 3,*(void **)(pAVar9 + 8),*(size_t *)(pAVar9 + 0x10));
        lVar8 = lVar8 + 3 + *(long *)(pAVar9 + 0x10);
        if (pAVar9[0x38] != (Attribute)0x1) goto LAB_0013403b;
        puVar4 = output->m_Buffer;
        puVar2 = puVar4 + lVar8;
        puVar2[0] = '\x10';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
        *(unkbyte10 *)(puVar4 + lVar8 + 8) = *(unkbyte10 *)(pAVar9 + 0x60);
LAB_00133f38:
        lVar8 = lVar8 + 0x18;
        break;
      case 0xc:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_1b0[0] = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<std::complex<float>>
                           (local_220,plVar1,local_240,(string *)local_1b0);
        if (local_1b0[0] != local_1a0) {
          operator_delete(local_1b0[0]);
        }
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
        }
        output = local_218;
        local_218->m_Buffer[lVar8] = 'B';
        *(Attribute *)(local_218->m_Buffer + lVar8 + 1) = pAVar9[0x28];
        *(Attribute *)(local_218->m_Buffer + lVar8 + 2) = pAVar9[0x10];
        memcpy(local_218->m_Buffer + lVar8 + 3,*(void **)(pAVar9 + 8),*(size_t *)(pAVar9 + 0x10));
        lVar8 = lVar8 + 3 + *(long *)(pAVar9 + 0x10);
        if (pAVar9[0x38] == (Attribute)0x1) {
          puVar4 = output->m_Buffer;
          puVar2 = puVar4 + lVar8;
          puVar2[0] = '\b';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          puVar2[4] = '\0';
          puVar2[5] = '\0';
          puVar2[6] = '\0';
          puVar2[7] = '\0';
          *(undefined8 *)(puVar4 + lVar8 + 8) = *(undefined8 *)(pAVar9 + 0x58);
          goto LAB_0013381e;
        }
        goto LAB_00133b8c;
      case 0xd:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_1d0[0] = local_1c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<std::complex<double>>
                           (local_220,plVar1,local_240,(string *)local_1d0);
        if (local_1d0[0] != local_1c0) {
          operator_delete(local_1d0[0]);
        }
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
        }
        output = local_218;
        local_218->m_Buffer[lVar8] = 'B';
        *(Attribute *)(local_218->m_Buffer + lVar8 + 1) = pAVar9[0x28];
        *(Attribute *)(local_218->m_Buffer + lVar8 + 2) = pAVar9[0x10];
        memcpy(local_218->m_Buffer + lVar8 + 3,*(void **)(pAVar9 + 8),*(size_t *)(pAVar9 + 0x10));
        lVar8 = lVar8 + 3 + *(long *)(pAVar9 + 0x10);
        if (pAVar9[0x38] == (Attribute)0x1) {
          puVar4 = output->m_Buffer;
          puVar2 = puVar4 + lVar8;
          puVar2[0] = '\x10';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          puVar2[4] = '\0';
          puVar2[5] = '\0';
          puVar2[6] = '\0';
          puVar2[7] = '\0';
          uVar7 = *(undefined8 *)(pAVar9 + 0x60);
          puVar4 = puVar4 + lVar8 + 8;
          *(undefined8 *)puVar4 = *(undefined8 *)(pAVar9 + 0x58);
          *(undefined8 *)(puVar4 + 8) = uVar7;
          goto LAB_00133f38;
        }
LAB_0013403b:
        pvVar6 = *(void **)(pAVar9 + 0x40);
        sVar11 = *(long *)(pAVar9 + 0x48) - (long)pvVar6;
        puVar2 = output->m_Buffer;
        *(size_t *)(puVar2 + lVar8) = sVar11;
        memcpy((size_t *)((long)(puVar2 + lVar8) + 8),pvVar6,sVar11);
        lVar8 = lVar8 + sVar11 + 8;
        break;
      case 0xe:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_210[0] = local_200;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<std::__cxx11::string>
                           (local_220,plVar1,local_240,(string *)local_210);
        if (local_210[0] != local_200) {
          operator_delete(local_210[0]);
        }
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
        }
        output->m_Buffer[lVar8] = 'B';
        *(Attribute *)(output->m_Buffer + lVar8 + 1) = pAVar9[0x28];
        *(Attribute *)(output->m_Buffer + lVar8 + 2) = pAVar9[0x10];
        memcpy(output->m_Buffer + lVar8 + 3,*(void **)(pAVar9 + 8),*(size_t *)(pAVar9 + 0x10));
        lVar5 = *(long *)(pAVar9 + 0x10);
        sVar11 = *(size_t *)(pAVar9 + 0x60);
        puVar2 = output->m_Buffer;
        *(size_t *)(puVar2 + lVar5 + lVar8 + 0xb + -8) = sVar11;
        memcpy(puVar2 + lVar5 + lVar8 + 0xb,*(void **)(pAVar9 + 0x58),sVar11);
        lVar8 = lVar8 + lVar5 + 0xb + *(long *)(pAVar9 + 0x60);
        break;
      case 0xf:
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/","");
        pAVar9 = adios2::core::IO::InquireAttribute<char>
                           (local_220,plVar1,local_240,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
        }
LAB_001335c7:
        output->m_Buffer[lVar8] = 'B';
        *(Attribute *)(output->m_Buffer + lVar8 + 1) = pAVar9[0x28];
        *(Attribute *)(output->m_Buffer + lVar8 + 2) = pAVar9[0x10];
        memcpy(output->m_Buffer + lVar8 + 3,*(void **)(pAVar9 + 8),*(size_t *)(pAVar9 + 0x10));
        lVar8 = lVar8 + 3 + *(long *)(pAVar9 + 0x10);
        AVar3 = pAVar9[0x38];
joined_r0x0013360b:
        if (AVar3 != (Attribute)0x1) goto LAB_0013403b;
        puVar4 = output->m_Buffer;
        puVar2 = puVar4 + lVar8;
        puVar2[0] = '\x01';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
        *(Attribute *)(puVar4 + lVar8 + 8) = pAVar9[0x58];
        lVar8 = lVar8 + 9;
      }
LAB_0013406a:
      *(long *)output->m_Buffer = lVar8;
      plVar10 = (long *)*plVar10;
    } while (plVar10 != (long *)0x0);
  }
  return;
}

Assistant:

void SerializeAttributes(IO &input, Buffer &output)
{
    const auto &attributeMap = input.GetAttributes();
    for (const auto &attributePair : attributeMap)
    {
        uint64_t pos = output.value<uint64_t>();
        output.resize(pos + 1024);

        if (attributePair.second->m_Type == DataType::String)
        {
            const auto &attribute = input.InquireAttribute<std::string>(attributePair.first);
            output[pos] = 66;
            ++pos;
            output[pos] = static_cast<uint8_t>(attribute->m_Type);
            ++pos;
            output[pos] = static_cast<uint8_t>(attribute->m_Name.size());
            ++pos;
            std::memcpy(output.data(pos), attribute->m_Name.data(), attribute->m_Name.size());
            pos += attribute->m_Name.size();
            output.value<uint64_t>(pos) = attribute->m_DataSingleValue.size();
            pos += 8;
            std::memcpy(output.data(pos), attribute->m_DataSingleValue.data(),
                        attribute->m_DataSingleValue.size());
            pos += attribute->m_DataSingleValue.size();
        }
#define declare_type(T)                                                                            \
    else if (attributePair.second->m_Type == helper::GetDataType<T>())                             \
    {                                                                                              \
        const auto &attribute = input.InquireAttribute<T>(attributePair.first);                    \
        output[pos] = 66;                                                                          \
        ++pos;                                                                                     \
        output[pos] = static_cast<uint8_t>(attribute->m_Type);                                     \
        ++pos;                                                                                     \
        output[pos] = static_cast<uint8_t>(attribute->m_Name.size());                              \
        ++pos;                                                                                     \
        std::memcpy(output.data(pos), attribute->m_Name.data(), attribute->m_Name.size());         \
        pos += attribute->m_Name.size();                                                           \
        if (attribute->m_IsSingleValue)                                                            \
        {                                                                                          \
            output.value<uint64_t>(pos) = sizeof(T);                                               \
            pos += 8;                                                                              \
            output.value<T>(pos) = attribute->m_DataSingleValue;                                   \
            pos += sizeof(T);                                                                      \
        }                                                                                          \
        else                                                                                       \
        {                                                                                          \
            uint64_t size = sizeof(T) * attribute->m_DataArray.size();                             \
            output.value<uint64_t>(pos) = size;                                                    \
            pos += 8;                                                                              \
            std::memcpy(output.data(pos), attribute->m_DataArray.data(), size);                    \
            pos += size;                                                                           \
        }                                                                                          \
    }
        ADIOS2_FOREACH_ATTRIBUTE_STDTYPE_1ARG(declare_type)
#undef declare_type
        output.value<uint64_t>() = pos;
    }
}